

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test_fragment_uri.cc
# Opt level: O2

void __thiscall
anon_unknown.dwarf_13368::FragmentURITest_ParseRangeEnd_Test::~FragmentURITest_ParseRangeEnd_Test
          (FragmentURITest_ParseRangeEnd_Test *this)

{
  testing::Test::~Test((Test *)this);
  operator_delete(this,0x10);
  return;
}

Assistant:

TEST_F(FragmentURITest, ParseRangeEnd) {
    EXPECT_EQ(ktx::parseFragmentURI("m=,0").mip, ktx::SelectorRange(0, 1));
    EXPECT_EQ(ktx::parseFragmentURI("a=,0").stratal, ktx::SelectorRange(0, 1));
    EXPECT_EQ(ktx::parseFragmentURI("f=,0").facial, ktx::SelectorRange(0, 1));

    EXPECT_EQ(ktx::parseFragmentURI("m=,1").mip, ktx::SelectorRange(0, 2));
    EXPECT_EQ(ktx::parseFragmentURI("a=,1").stratal, ktx::SelectorRange(0, 2));
    EXPECT_EQ(ktx::parseFragmentURI("f=,1").facial, ktx::SelectorRange(0, 2));
}